

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_solid.cc
# Opt level: O3

void __thiscall hwtest::pgraph::MthdCharXyc::emulate_mthd(MthdCharXyc *this)

{
  pgraph_state *state;
  uint32_t *puVar1;
  byte *pbVar2;
  int cstat;
  int cstat_00;
  ulong uVar3;
  uint32_t coord;
  
  state = &(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp;
  pgraph_clear_vtxid(state);
  pgraph_bump_vtxid(state);
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1;
  *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
  puVar1 = (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_1 + 1;
  *(byte *)puVar1 = (byte)*puVar1 | 1;
  pbVar2 = (byte *)((long)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xy_misc_3
                   + 1);
  *pbVar2 = *pbVar2 & 0xfe;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] =
       (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.valid[0] & 0xfff7efef |
       0x1010;
  uVar3 = (ulong)(int)(this->super_SingleMthdTest).super_MthdTest.val;
  coord = (uint32_t)((long)(uVar3 << 0x2c) >> 0x34);
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][0] = coord;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy[4][1] =
       (uint32_t)(uVar3 >> 0x14);
  cstat = nv04_pgraph_clip_status(state,coord,0);
  cstat_00 = nv04_pgraph_clip_status
                       (state,(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.vtx_xy
                              [4][1],1);
  pgraph_set_xy_d(state,0,0,0,false,false,false,cstat);
  pgraph_set_xy_d(state,1,0,0,false,false,false,cstat_00);
  *(ushort *)&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.dma_misc =
       (ushort)(byte)(this->super_SingleMthdTest).super_MthdTest.val;
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.skip = true;
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_clear_vtxid(&exp);
		pgraph_bump_vtxid(&exp);
		insrt(exp.xy_misc_1[0], 0, 1, 0);
		insrt(exp.xy_misc_1[1], 0, 1, 1);
		insrt(exp.xy_misc_3, 8, 1, 0);
		insrt(exp.valid[0], 4, 1, 1);
		insrt(exp.valid[0], 0xc, 1, 1);
		insrt(exp.valid[0], 19, 1, 0);
		exp.vtx_xy[4][0] = extrs(val, 8, 12);
		exp.vtx_xy[4][1] = extrs(val, 20, 12);
		int xcstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[4][0], 0);
		int ycstat = nv04_pgraph_clip_status(&exp, exp.vtx_xy[4][1], 1);
		pgraph_set_xy_d(&exp, 0, 0, 0, false, false, false, xcstat);
		pgraph_set_xy_d(&exp, 1, 0, 0, false, false, false, ycstat);
		insrt(exp.dma_misc, 0, 16, extr(val, 0, 8));
		// XXX: do it right
		skip = true;
	}